

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_dsp_common.h
# Opt level: O0

uint16_t clip_pixel_highbd(int val,int bd)

{
  int iVar1;
  int in_ESI;
  int in_EDI;
  
  if (in_ESI != 8) {
    if (in_ESI == 10) {
      iVar1 = clamp(in_EDI,0,0x3ff);
      return (uint16_t)iVar1;
    }
    if (in_ESI == 0xc) {
      iVar1 = clamp(in_EDI,0,0xfff);
      return (uint16_t)iVar1;
    }
  }
  iVar1 = clamp(in_EDI,0,0xff);
  return (uint16_t)iVar1;
}

Assistant:

static inline uint16_t clip_pixel_highbd(int val, int bd) {
  switch (bd) {
    case 8:
    default: return (uint16_t)clamp(val, 0, 255);
    case 10: return (uint16_t)clamp(val, 0, 1023);
    case 12: return (uint16_t)clamp(val, 0, 4095);
  }
}